

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

void __thiscall QStatusBar::paintEvent(QStatusBar *this,QPaintEvent *event)

{
  long lVar1;
  QStatusBarPrivate *this_00;
  long lVar2;
  SBItem *pSVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  QStyle *pQVar7;
  QPalette *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QRect local_d8;
  QPainter p;
  QStyleOption opt_1;
  QStyleOption opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QStatusBarPrivate **)&(this->super_QWidget).field_0x8;
  lVar2 = (this_00->tempItem).d.size;
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,&(this->super_QWidget).super_QPaintDevice);
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom(&opt,&this->super_QWidget);
  pQVar7 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar7 + 0xb0))(pQVar7,0x2e,&opt,&p,this);
  pSVar3 = (this_00->items).d.ptr;
  lVar4 = (this_00->items).d.size;
  for (lVar9 = 0; lVar4 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
    lVar5 = *(long *)(*(long *)((long)&pSVar3->widget + lVar9) + 0x20);
    if (((*(byte *)(lVar5 + 9) & 0x80) != 0) &&
       ((lVar2 == 0 || (*(int *)((long)&pSVar3->category + lVar9) == 1)))) {
      QVar10 = QRect::adjusted((QRect *)(lVar5 + 0x14),-2,-1,2,1);
      cVar6 = QRect::intersects((QRect *)(event + 0x10));
      if (cVar6 != '\0') {
        opt_1.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt_1.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        opt_1._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt_1.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        opt_1.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt_1.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt_1._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt_1._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStyleOption::QStyleOption(&opt_1,0,0);
        local_d8._0_8_ = QVar10._0_8_;
        local_d8._8_8_ = QVar10._8_8_;
        opt_1.rect.x1.m_i = local_d8.x1.m_i;
        opt_1.rect.y1.m_i = local_d8.y1.m_i;
        opt_1.rect.x2.m_i = local_d8.x2.m_i;
        opt_1.rect.y2.m_i = local_d8.y2.m_i;
        pQVar8 = QWidget::palette(&this->super_QWidget);
        QPalette::operator=(&opt_1.palette,pQVar8);
        opt_1.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
        pQVar7 = QWidget::style(&this->super_QWidget);
        (**(code **)(*(long *)pQVar7 + 0xb0))
                  (pQVar7,7,&opt_1,&p,*(undefined8 *)((long)&pSVar3->widget + lVar9));
        QStyleOption::~QStyleOption(&opt_1);
      }
    }
  }
  if (lVar2 != 0) {
    pQVar8 = QWidget::palette(&this->super_QWidget);
    QPalette::windowText(pQVar8);
    QPainter::setPen((QColor *)&p);
    opt_1._0_16_ = QStatusBarPrivate::messageRect(this_00);
    QPainter::drawText((QRect *)&p,(int)&opt_1,(QString *)0x181,(QRect *)&this_00->tempItem);
  }
  QStyleOption::~QStyleOption(&opt);
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusBar::paintEvent(QPaintEvent *event)
{
    Q_D(QStatusBar);
    bool haveMessage = !d->tempItem.isEmpty();

    QPainter p(this);
    QStyleOption opt;
    opt.initFrom(this);
    style()->drawPrimitive(QStyle::PE_PanelStatusBar, &opt, &p, this);

    for (const auto &item : std::as_const(d->items)) {
        if (item.widget->isVisible() && (!haveMessage || item.isPermanent())) {
            QRect ir = item.widget->geometry().adjusted(-2, -1, 2, 1);
            if (event->rect().intersects(ir)) {
                QStyleOption opt(0);
                opt.rect = ir;
                opt.palette = palette();
                opt.state = QStyle::State_None;
                style()->drawPrimitive(QStyle::PE_FrameStatusBarItem, &opt, &p, item.widget);
            }
        }
    }
    if (haveMessage) {
        p.setPen(palette().windowText().color());
        p.drawText(d->messageRect(), Qt::AlignLeading | Qt::AlignVCenter | Qt::TextSingleLine, d->tempItem);
    }
}